

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine.cpp
# Opt level: O0

QNetworkInterface __thiscall QNativeSocketEngine::multicastInterface(QNativeSocketEngine *this)

{
  long lVar1;
  QNativeSocketEnginePrivate *this_00;
  ulong uVar2;
  long *in_RSI;
  QNetworkInterfacePrivate *in_RDI;
  long in_FS_OFFSET;
  QNativeSocketEnginePrivate *d;
  QSharedDataPointer<QNetworkInterfacePrivate> QVar3;
  int line;
  char local_48 [32];
  char local_28 [8];
  QNativeSocketEnginePrivate *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QVar3.d.ptr = (totally_ordered_wrapper<QNetworkInterfacePrivate_*>)
                (totally_ordered_wrapper<QNetworkInterfacePrivate_*>)in_RDI;
  this_00 = d_func((QNativeSocketEngine *)0x25fccb);
  uVar2 = (**(code **)(*in_RSI + 0x78))();
  line = (int)((ulong)QVar3.d.ptr >> 0x20);
  if ((uVar2 & 1) == 0) {
    QMessageLogger::QMessageLogger((QMessageLogger *)this_00,(char *)in_RSI,line,(char *)in_RDI);
    QMessageLogger::warning
              (local_28,
               "QNativeSocketEngine::multicastInterface() was called on an uninitialized socket device"
              );
    QNetworkInterface::QNetworkInterface((QNetworkInterface *)0x25fd0e);
  }
  else if ((this_00->super_QAbstractSocketEnginePrivate).socketType == UdpSocket) {
    QNativeSocketEnginePrivate::nativeMulticastInterface(in_stack_ffffffffffffffe0);
  }
  else {
    QMessageLogger::QMessageLogger((QMessageLogger *)this_00,(char *)in_RSI,line,(char *)in_RDI);
    QMessageLogger::warning
              (local_48,
               "QNativeSocketEngine::multicastInterface() was called by a socket other than QAbstractSocket::UdpSocket"
              );
    QNetworkInterface::QNetworkInterface((QNetworkInterface *)0x25fd51);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QSharedDataPointer<QNetworkInterfacePrivate>)
           (QSharedDataPointer<QNetworkInterfacePrivate>)QVar3.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkInterface QNativeSocketEngine::multicastInterface() const
{
    Q_D(const QNativeSocketEngine);
    Q_CHECK_VALID_SOCKETLAYER(QNativeSocketEngine::multicastInterface(), QNetworkInterface());
    Q_CHECK_TYPE(QNativeSocketEngine::multicastInterface(), QAbstractSocket::UdpSocket, QNetworkInterface());
    return d->nativeMulticastInterface();
}